

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int __thiscall AActor::GetModifiedDamage(AActor *this,FName *damagetype,int damage,bool passive)

{
  AInventory *pAVar1;
  int local_10;
  int local_c;
  
  pAVar1 = (this->Inventory).field_0.p;
  if (pAVar1 != (AInventory *)0x0) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      local_c = damagetype->Index;
      local_10 = damage;
      (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2c])
                (pAVar1,damage,&local_c,&local_10,(ulong)passive);
      damage = local_10;
    }
    else {
      (this->Inventory).field_0.p = (AInventory *)0x0;
    }
  }
  return damage;
}

Assistant:

int AActor::GetModifiedDamage(FName damagetype, int damage, bool passive)
{
	if (Inventory != nullptr)
		Inventory->ModifyDamage(damage, damagetype, damage, passive);

	return damage;
}